

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_mull_32_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint64 res;
  uint64 dst;
  uint64 src;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar3 = m68ki_read_imm_16();
    uVar4 = OPER_PCDI_32();
    m68ki_cpu.c_flag = 0;
    if ((uVar3 & 0x800) == 0) {
      uVar6 = (ulong)uVar4 * (ulong)m68ki_cpu.dar[uVar3 >> 0xc & 7];
      uVar1 = (uint)uVar6;
      if ((uVar3 & 0x400) == 0) {
        m68ki_cpu.n_flag = (uint)(uVar6 >> 0x18);
        m68ki_cpu.v_flag = (uint)(0xffffffff < uVar6) << 7;
        m68ki_cpu.not_z_flag = uVar1;
        m68ki_cpu.dar[uVar3 >> 0xc & 7] = uVar1;
      }
      else {
        uVar2 = (uint)(uVar6 >> 0x20);
        m68ki_cpu.not_z_flag = uVar1 | uVar2;
        m68ki_cpu.n_flag = (uint)(byte)(uVar6 >> 0x38);
        m68ki_cpu.v_flag = 0;
        m68ki_cpu.dar[uVar3 & 7] = uVar2;
        m68ki_cpu.dar[uVar3 >> 0xc & 7] = uVar1;
      }
    }
    else {
      lVar5 = (long)(int)uVar4 * (long)(int)m68ki_cpu.dar[uVar3 >> 0xc & 7];
      uVar1 = (uint)lVar5;
      if ((uVar3 & 0x400) == 0) {
        m68ki_cpu.n_flag = (uint)((ulong)lVar5 >> 0x18);
        m68ki_cpu.v_flag = (uint)(lVar5 != (int)uVar1) << 7;
        m68ki_cpu.not_z_flag = uVar1;
        m68ki_cpu.dar[uVar3 >> 0xc & 7] = uVar1;
      }
      else {
        uVar2 = (uint)((ulong)lVar5 >> 0x20);
        m68ki_cpu.not_z_flag = uVar1 | uVar2;
        m68ki_cpu.n_flag = (uint)(byte)((ulong)lVar5 >> 0x38);
        m68ki_cpu.v_flag = 0;
        m68ki_cpu.dar[uVar3 & 7] = uVar2;
        m68ki_cpu.dar[uVar3 >> 0xc & 7] = uVar1;
      }
    }
  }
  return;
}

Assistant:

static void m68k_op_mull_32_pcdi(void)
{
#if M68K_USE_64_BIT

	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint64 src = OPER_PCDI_32();
		uint64 dst = REG_D[(word2 >> 12) & 7];
		uint64 res;

		FLAG_C = CFLAG_CLEAR;

		if(BIT_B(word2))			   /* signed */
		{
			res = (sint64)((sint32)src) * (sint64)((sint32)dst);
			if(!BIT_A(word2))
			{
				FLAG_Z = MASK_OUT_ABOVE_32(res);
				FLAG_N = NFLAG_32(res);
				FLAG_V = ((sint64)res != (sint32)res)<<7;
				REG_D[(word2 >> 12) & 7] = FLAG_Z;
				return;
			}
			FLAG_Z = MASK_OUT_ABOVE_32(res) | (res>>32);
			FLAG_N = NFLAG_64(res);
			FLAG_V = VFLAG_CLEAR;
			REG_D[word2 & 7] = (res >> 32);
			REG_D[(word2 >> 12) & 7] = MASK_OUT_ABOVE_32(res);
			return;
		}

		res = src * dst;
		if(!BIT_A(word2))
		{
			FLAG_Z = MASK_OUT_ABOVE_32(res);
			FLAG_N = NFLAG_32(res);
			FLAG_V = (res > 0xffffffff)<<7;
			REG_D[(word2 >> 12) & 7] = FLAG_Z;
			return;
		}
		FLAG_Z = MASK_OUT_ABOVE_32(res) | (res>>32);
		FLAG_N = NFLAG_64(res);
		FLAG_V = VFLAG_CLEAR;
		REG_D[word2 & 7] = (res >> 32);
		REG_D[(word2 >> 12) & 7] = MASK_OUT_ABOVE_32(res);
		return;
	}
	m68ki_exception_illegal();

#else

	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint src = OPER_PCDI_32();
		uint dst = REG_D[(word2 >> 12) & 7];
		uint neg = GET_MSB_32(src ^ dst);
		uint src1;
		uint src2;
		uint dst1;
		uint dst2;
		uint r1;
		uint r2;
		uint r3;
		uint r4;
		uint lo;
		uint hi;

		FLAG_C = CFLAG_CLEAR;

		if(BIT_B(word2))			   /* signed */
		{
			if(GET_MSB_32(src))
				src = (uint)MASK_OUT_ABOVE_32(-(sint)src);
			if(GET_MSB_32(dst))
				dst = (uint)MASK_OUT_ABOVE_32(-(sint)dst);
		}

		src1 = MASK_OUT_ABOVE_16(src);
		src2 = src>>16;
		dst1 = MASK_OUT_ABOVE_16(dst);
		dst2 = dst>>16;


		r1 = src1 * dst1;
		r2 = src1 * dst2;
		r3 = src2 * dst1;
		r4 = src2 * dst2;

		lo = r1 + (MASK_OUT_ABOVE_16(r2)<<16) + (MASK_OUT_ABOVE_16(r3)<<16);
		hi = r4 + (r2>>16) + (r3>>16) + (((r1>>16) + MASK_OUT_ABOVE_16(r2) + MASK_OUT_ABOVE_16(r3)) >> 16);

		if(BIT_B(word2) && neg)
		{
			hi = (uint)MASK_OUT_ABOVE_32((-(sint)hi) - (lo != 0));
			lo = (uint)MASK_OUT_ABOVE_32(-(sint)lo);
		}

		if(BIT_A(word2))
		{
			REG_D[word2 & 7] = hi;
			REG_D[(word2 >> 12) & 7] = lo;
			FLAG_N = NFLAG_32(hi);
			FLAG_Z = hi | lo;
			FLAG_V = VFLAG_CLEAR;
			return;
		}

		REG_D[(word2 >> 12) & 7] = lo;
		FLAG_N = NFLAG_32(lo);
		FLAG_Z = lo;
		if(BIT_B(word2))
			FLAG_V = (!((GET_MSB_32(lo) && hi == 0xffffffff) || (!GET_MSB_32(lo) && !hi)))<<7;
		else
			FLAG_V = (hi != 0) << 7;
		return;
	}
	m68ki_exception_illegal();

#endif
}